

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVodeQuadSVtolerancesB(void *cvode_mem,int which,sunrealtype reltolQB,N_Vector abstolQB)

{
  CVadjMemRec *cvode_mem_00;
  int in_ESI;
  CVodeMem in_RDI;
  int flag;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMemRec *reltolQ;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x51e,"CVodeQuadSVtolerancesB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x526,"CVodeQuadSVtolerancesB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else {
    cvode_mem_00 = in_RDI->cv_adj_mem;
    if (in_ESI < cvode_mem_00->ca_nbckpbs) {
      for (reltolQ = cvode_mem_00->cvB_mem;
          (reltolQ != (CVodeBMemRec *)0x0 && (in_ESI != reltolQ->cv_index));
          reltolQ = reltolQ->cv_next) {
      }
      local_4 = CVodeQuadSVtolerances(cvode_mem_00,(sunrealtype)reltolQ,(N_Vector)reltolQ->cv_mem);
    }
    else {
      cvProcessError(in_RDI,-0x16,0x52e,"CVodeQuadSVtolerancesB",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                     ,"Illegal value for which.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int CVodeQuadSVtolerancesB(void* cvode_mem, int which, sunrealtype reltolQB,
                           N_Vector abstolQB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  flag = CVodeQuadSVtolerances(cvodeB_mem, reltolQB, abstolQB);

  return (flag);
}